

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

bool __thiscall inja::Renderer::truthy(Renderer *this,json *var)

{
  bool bVar1;
  type_error *e;
  json *var_local;
  Renderer *this_local;
  
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::empty(var);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::is_number(var);
    if (bVar1) {
      this_local._7_1_ = nlohmann::operator!=<int,_0>(var,0);
    }
    else {
      bVar1 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::is_string(var);
      if (bVar1) {
        bVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::empty(var);
        this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
      }
      else {
        this_local._7_1_ =
             nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::get<bool,_bool,_0>(var);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool truthy(const json& var) const {
		if (var.empty()) {
			return false;
		} else if (var.is_number()) {
			return (var != 0);
		} else if (var.is_string()) {
			return !var.empty();
		}

		try {
			return var.get<bool>();
		} catch (json::type_error& e) {
			inja_throw("json_error", e.what());
			throw;
		}
	}